

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtls_openssl.cpp
# Opt level: O0

void __thiscall
QTlsPrivate::TlsCryptographOpenSSL::alertMessageSent(TlsCryptographOpenSSL *this,int value)

{
  AlertLevel AVar1;
  AlertType AVar2;
  ulong uVar3;
  int in_ESI;
  long in_RDI;
  long in_FS_OFFSET;
  AlertLevel level;
  int in_stack_ffffffffffffffb0;
  AlertLevel AVar4;
  undefined1 local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  AVar1 = anon_unknown.dwarf_10d188::tlsAlertLevel(in_stack_ffffffffffffffb0);
  if (AVar1 == Fatal) {
    uVar3 = QSslSocket::isEncrypted();
    if ((uVar3 & 1) == 0) {
      *(undefined1 *)(in_RDI + 0xf1) = 1;
    }
  }
  AVar4 = (AlertLevel)*(undefined8 *)(in_RDI + 0x10);
  AVar2 = anon_unknown.dwarf_10d188::tlsAlertType(in_ESI);
  anon_unknown.dwarf_10d188::tlsAlertDescription((int)((ulong)local_20 >> 0x20));
  QSslSocket::alertSent(AVar4,AVar1,(QString *)(ulong)AVar2);
  QString::~QString((QString *)0x1505d2);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void TlsCryptographOpenSSL::alertMessageSent(int value)
{
    Q_ASSERT(q);
    Q_ASSERT(d);

    const auto level = tlsAlertLevel(value);
    if (level == QSsl::AlertLevel::Fatal && !q->isEncrypted()) {
        // Note, this logic is handshake-time only:
        pendingFatalAlert = true;
    }

    emit q->alertSent(level, tlsAlertType(value), tlsAlertDescription(value));

}